

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int CmdCommandSis(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_NtkType_t AVar2;
  Abc_Ntk_t *pNtk;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  FILE *pFVar5;
  Abc_Ntk_t *pAVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  char Command [1000];
  char Buffer [100];
  char local_488 [8];
  char acStack_480 [7];
  undefined8 uStack_479;
  char local_98 [104];
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  if ((argc == 1) ||
     ((pcVar3 = argv[1], *pcVar3 == '-' &&
      (((pcVar3[1] == 'h' && (pcVar3[2] == '\0')) || ((pcVar3[1] == '?' && (pcVar3[2] == '\0')))))))
     ) goto LAB_0089491c;
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
    sVar7 = 0xf;
  }
  else {
    pcVar3 = *argv;
    pcVar8 = "sis";
    iVar1 = strcmp(pcVar3,"sis");
    if (iVar1 != 0) {
      fprintf(__stream,"Wrong command: \"%s\".\n",pcVar3);
      goto LAB_0089491c;
    }
    pcVar3 = Cmd_FlagReadByName(pAbc,"siswin");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "sis.exe";
    }
    else {
      pcVar3 = Cmd_FlagReadByName(pAbc,"siswin");
    }
    pcVar4 = Cmd_FlagReadByName(pAbc,"sisunix");
    if (pcVar4 != (char *)0x0) {
      pcVar8 = Cmd_FlagReadByName(pAbc,"sisunix");
    }
    pFVar5 = fopen(pcVar3,"r");
    pcVar4 = pcVar3;
    if ((pFVar5 == (FILE *)0x0) &&
       (pFVar5 = fopen(pcVar8,"r"), pcVar4 = pcVar8, pFVar5 == (FILE *)0x0)) {
      fprintf(__stream,"Cannot find \"%s\" or \"%s\" in the current directory.\n",pcVar3,pcVar8);
      goto LAB_0089491c;
    }
    fclose(pFVar5);
    AVar2 = pNtk->ntkType;
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      if (AVar2 == ABC_NTK_LOGIC) {
        Abc_NtkMapToSop(pNtk);
        puts("The current network is unmapped before calling SIS.");
        AVar2 = pNtk->ntkType;
        goto LAB_00894ab7;
      }
    }
    else {
LAB_00894ab7:
      if (AVar2 == ABC_NTK_LOGIC) {
        Abc_NtkToSop(pNtk,-1,1000000000);
      }
    }
    pAVar6 = Abc_NtkToNetlist(pNtk);
    if (pAVar6 != (Abc_Ntk_t *)0x0) {
      Io_WriteBlif(pAVar6,"_sis_in.blif",1,0,0);
      Abc_NtkDelete(pAVar6);
      sprintf(local_488,"%s -x -c ",pcVar4);
      sVar7 = strlen(local_488);
      (local_488 + sVar7)[0] = '\"';
      (local_488 + sVar7)[1] = '\0';
      sVar7 = strlen(local_488);
      *(undefined8 *)((long)&uStack_479 + sVar7) = 0x66696c622e6e69;
      builtin_strncpy(local_488 + sVar7,"read_bli",8);
      builtin_strncpy(acStack_480 + sVar7,"f _sis_i",8);
      sVar7 = strlen(local_488);
      (local_488 + sVar7)[0] = ';';
      (local_488 + sVar7)[1] = ' ';
      local_488[sVar7 + 2] = '\0';
      if (1 < argc) {
        uVar9 = 1;
        do {
          sprintf(local_98," %s",argv[uVar9]);
          strcat(local_488,local_98);
          uVar9 = uVar9 + 1;
        } while ((uint)argc != uVar9);
      }
      sVar7 = strlen(local_488);
      (local_488 + sVar7)[0] = ';';
      (local_488 + sVar7)[1] = ' ';
      local_488[sVar7 + 2] = '\0';
      sVar7 = strlen(local_488);
      builtin_strncpy(local_488 + sVar7,"write_bl",8);
      builtin_strncpy(acStack_480 + sVar7,"if _sis_o",9);
      builtin_strncpy((char *)((long)&uStack_479 + sVar7 + 2),"ut.blif",8);
      sVar7 = strlen(local_488);
      (local_488 + sVar7)[0] = '\"';
      (local_488 + sVar7)[1] = '\0';
      iVar1 = Util_SignalSystem(local_488);
      if (iVar1 == 0) {
        pFVar5 = fopen("_sis_out.blif","r");
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          pAVar6 = Io_Read("_sis_out.blif",IO_FILE_BLIF,1,0);
          pcVar3 = pNtk->pSpec;
          if (pcVar3 != (char *)0x0) {
            if (pAVar6->pSpec != (char *)0x0) {
              free(pAVar6->pSpec);
              pAVar6->pSpec = (char *)0x0;
              pcVar3 = pNtk->pSpec;
            }
            pcVar3 = Extra_UtilStrsav(pcVar3);
            pAVar6->pSpec = pcVar3;
          }
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar6);
          unlink("_sis_in.blif");
          unlink("_sis_out.blif");
          return 0;
        }
        pcVar8 = "Cannot open SIS output file \"%s\".\n";
        pcVar3 = "_sis_out.blif";
      }
      else {
        fwrite("The following command has returned non-zero exit status:\n",0x39,1,__stream);
        pcVar8 = "\"%s\"\n";
        pcVar3 = local_488;
      }
      fprintf(__stream,pcVar8,pcVar3);
      unlink("_sis_in.blif");
      goto LAB_0089491c;
    }
    pcVar3 = "Cannot produce the intermediate network.\n";
    sVar7 = 0x29;
  }
  fwrite(pcVar3,sVar7,1,__stream);
LAB_0089491c:
  fwrite("Usage: sis [-h] <com>\n",0x16,1,__stream);
  fwrite("         invokes SIS command for the current ABC network\n",0x39,1,__stream);
  fwrite("         (the executable of SIS should be in the same directory)\n",0x41,1,__stream);
  fwrite("   -h  : print the command usage\n",0x21,1,__stream);
  fwrite(" <com> : a SIS command (or a semicolon-separated list of commands in quotes)\n",0x4d,1,
         __stream);
  fwrite("         Example 1: sis eliminate 0\n",0x24,1,__stream);
  fwrite("         Example 2: sis \"ps; rd; fx; ps\"\n",0x29,1,__stream);
  fwrite("         Example 3: sis source script.rugged\n",0x2d,1,__stream);
  return 1;
}

Assistant:

int CmdCommandSis( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkNew, * pNetlist;
    char * pNameWin = "sis.exe";
    char * pNameUnix = "sis";
    char Command[1000], Buffer[100];
    char * pSisName;
    int i;

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if ( argc == 1 )
        goto usage;
    if ( strcmp( argv[1], "-h" ) == 0 )
        goto usage;
    if ( strcmp( argv[1], "-?" ) == 0 )
        goto usage;

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        goto usage;
    }

    if ( strcmp( argv[0], "sis" ) != 0 )
    {
        fprintf( pErr, "Wrong command: \"%s\".\n", argv[0] );
        goto usage;
    }

    // get the names from the resource file
    if ( Cmd_FlagReadByName(pAbc, "siswin") )
        pNameWin = Cmd_FlagReadByName(pAbc, "siswin");
    if ( Cmd_FlagReadByName(pAbc, "sisunix") )
        pNameUnix = Cmd_FlagReadByName(pAbc, "sisunix");

    // check if SIS is available
    if ( (pFile = fopen( pNameWin, "r" )) )
        pSisName = pNameWin;
    else if ( (pFile = fopen( pNameUnix, "r" )) )
        pSisName = pNameUnix;
    else if ( pFile == NULL )
    {
        fprintf( pErr, "Cannot find \"%s\" or \"%s\" in the current directory.\n", pNameWin, pNameUnix );
        goto usage;
    }
    fclose( pFile );

    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        Abc_NtkMapToSop(pNtk);
        printf( "The current network is unmapped before calling SIS.\n" );
    }

    // write out the current network
    if ( Abc_NtkIsLogic(pNtk) )
        Abc_NtkToSop(pNtk, -1, ABC_INFINITY);
    pNetlist = Abc_NtkToNetlist(pNtk);
    if ( pNetlist == NULL )
    {
        fprintf( pErr, "Cannot produce the intermediate network.\n" );
        goto usage;
    }
    Io_WriteBlif( pNetlist, "_sis_in.blif", 1, 0, 0 );
    Abc_NtkDelete( pNetlist );

    // create the file for sis
    sprintf( Command, "%s -x -c ", pSisName );
    strcat ( Command, "\"" );
    strcat ( Command, "read_blif _sis_in.blif" );
    strcat ( Command, "; " );
    for ( i = 1; i < argc; i++ )
    {
        sprintf( Buffer, " %s", argv[i] );
        strcat( Command, Buffer );
    }
    strcat( Command, "; " );
    strcat( Command, "write_blif _sis_out.blif" );
    strcat( Command, "\"" );

    // call SIS
    if ( Util_SignalSystem( Command ) )
    {
        fprintf( pErr, "The following command has returned non-zero exit status:\n" );
        fprintf( pErr, "\"%s\"\n", Command );
        unlink( "_sis_in.blif" );
        goto usage;
    }

    // read in the SIS output
    if ( (pFile = fopen( "_sis_out.blif", "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open SIS output file \"%s\".\n", "_sis_out.blif" );
        unlink( "_sis_in.blif" );
        goto usage;
    }
    fclose( pFile );

    // set the new network
    pNtkNew = Io_Read( "_sis_out.blif", IO_FILE_BLIF, 1, 0 );
    // set the original spec of the new network
    if ( pNtk->pSpec )
    {
        ABC_FREE( pNtkNew->pSpec );
        pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );

    // remove temporary networks
    unlink( "_sis_in.blif" );
    unlink( "_sis_out.blif" );
    return 0;

usage:
    fprintf( pErr, "Usage: sis [-h] <com>\n");
    fprintf( pErr, "         invokes SIS command for the current ABC network\n" );
    fprintf( pErr, "         (the executable of SIS should be in the same directory)\n" );
    fprintf( pErr, "   -h  : print the command usage\n" );
    fprintf( pErr, " <com> : a SIS command (or a semicolon-separated list of commands in quotes)\n" );
    fprintf( pErr, "         Example 1: sis eliminate 0\n" );
    fprintf( pErr, "         Example 2: sis \"ps; rd; fx; ps\"\n" );
    fprintf( pErr, "         Example 3: sis source script.rugged\n" );
    return 1;                   // error exit
}